

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder<testing::internal::ValueArray<unsigned_int>,_testing::internal::ValueArray<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProductGenerator<int,_aom_rc_mode,_int> *in_RSI;
  tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  *in_RDI;
  ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_> PVar1;
  tuple<testing::internal::ValueArray<unsigned_int>,_testing::internal::ValueArray<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  *in_stack_ffffffffffffff88;
  tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  *g;
  
  g = in_RDI;
  operator_new(0x38);
  std::
  tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  ::
  tuple<testing::internal::ValueArray<unsigned_int>,_testing::internal::ValueArray<aom_rc_mode>,_testing::internal::ParamGenerator<int>,_true,_true>
            (in_RDI,in_stack_ffffffffffffff88);
  CartesianProductGenerator<int,_aom_rc_mode,_int>::CartesianProductGenerator(in_RSI,g);
  ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_>::ParamGenerator
            ((ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_> *)in_RDI,
             (ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *)
             in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  ::~tuple((tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
            *)0x88f68b);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)g;
  return (ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }